

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDSharedSimd128.cpp
# Opt level: O1

Instr * __thiscall LowererMD::Simd128LowerLdLane(LowererMD *this,Instr *instr)

{
  IRType type;
  Opnd *this_00;
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  OpndKind OVar5;
  bool bVar6;
  byte bVar7;
  uint32 index;
  uint uVar8;
  undefined4 *puVar9;
  RegOpnd *pRVar10;
  Instr *pIVar11;
  Opnd *pOVar12;
  IntConstOpnd *pIVar13;
  Func *pFVar14;
  OpCode OVar15;
  OpCode opcode;
  int iVar16;
  IRType local_60;
  IntConstType local_50;
  RegOpnd *local_40;
  uint local_34;
  
  this_00 = instr->m_dst;
  local_40 = (RegOpnd *)instr->m_src1;
  pIVar13 = (IntConstOpnd *)instr->m_src2;
  if ((this_00 == (Opnd *)0x0) || (OVar5 = IR::Opnd::GetKind(this_00), OVar5 != OpndKindReg)) {
LAB_00673e18:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x27f,
                       "(dst && dst->IsRegOpnd() && (dst->GetType() == TyFloat32 || dst->GetType() == TyInt32 || dst->GetType() == TyUint32 || dst->GetType() == TyFloat64 || dst->IsInt64()))"
                       ,
                       "dst && dst->IsRegOpnd() && (dst->GetType() == TyFloat32 || dst->GetType() == TyInt32 || dst->GetType() == TyUint32 || dst->GetType() == TyFloat64 || dst->IsInt64())"
                      );
    if (!bVar6) goto LAB_006748fc;
    *puVar9 = 0;
  }
  else {
    type = this_00->m_type;
    if (((10 < type) || ((0x688U >> (type & 0x1f) & 1) == 0)) &&
       (bVar6 = IRType_IsInt64(type), !bVar6)) goto LAB_00673e18;
  }
  if (((local_40 == (RegOpnd *)0x0) ||
      (OVar5 = IR::Opnd::GetKind((Opnd *)local_40), OVar5 != OpndKindReg)) ||
     (bVar6 = IRType_IsSimd128((local_40->super_Opnd).m_type), !bVar6)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x280,"(src1 && src1->IsRegOpnd() && src1->IsSimd128())",
                       "src1 && src1->IsRegOpnd() && src1->IsSimd128()");
    if (!bVar6) goto LAB_006748fc;
    *puVar9 = 0;
  }
  if ((pIVar13 == (IntConstOpnd *)0x0) ||
     (OVar5 = IR::Opnd::GetKind((Opnd *)pIVar13), OVar5 != OpndKindIntConst)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x281,"(src2 && src2->IsIntConstOpnd())","src2 && src2->IsIntConstOpnd()");
    if (!bVar6) goto LAB_006748fc;
    *puVar9 = 0;
  }
  OVar5 = IR::Opnd::GetKind((Opnd *)pIVar13);
  if (OVar5 != OpndKindIntConst) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
    if (!bVar6) goto LAB_006748fc;
    *puVar9 = 0;
  }
  index = IR::IntConstOpnd::AsUint32(pIVar13);
  OVar15 = instr->m_opcode;
  opcode = MOVSS;
  local_60 = TyInt32;
  if (OVar15 < Simd128_ExtractLane_U4) {
    if (OVar15 < Simd128_ExtractLane_I4) {
      if (OVar15 != Simd128_ExtractLane_I2) {
        if (OVar15 == Simd128_ExtractLane_I16) goto LAB_0067418c;
LAB_00674046:
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                           ,0x2aa,"((0))","UNREACHED");
        if (!bVar6) goto LAB_006748fc;
        *puVar9 = 0;
        goto LAB_00674328;
      }
      iVar16 = 8;
      bVar6 = true;
    }
    else {
      if (OVar15 == Simd128_ExtractLane_I4) goto LAB_0067413a;
      if (OVar15 != Simd128_ExtractLane_F4) {
        if (OVar15 == Simd128_ExtractLane_I8) goto LAB_006740a6;
        goto LAB_00674046;
      }
      if (3 < index) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                           ,0x28d,"(laneIndex < 4)","laneIndex < 4");
        if (!bVar6) goto LAB_006748fc;
        *puVar9 = 0;
      }
LAB_00674328:
      iVar16 = 4;
      bVar6 = false;
    }
    local_34 = 0;
    bVar3 = false;
    bVar4 = false;
    local_50 = 0;
    bVar2 = false;
  }
  else {
    if (OVar15 < Simd128_ExtractLane_B4) {
      if (OVar15 == Simd128_ExtractLane_U4) {
LAB_0067413a:
        opcode = MOVD;
        bVar2 = true;
        iVar16 = 4;
        if (3 < index) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar9 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                             ,0x2a7,"(laneIndex < 4)","laneIndex < 4");
          if (!bVar6) goto LAB_006748fc;
          *puVar9 = 0;
          bVar4 = false;
          bVar3 = false;
          local_50 = 0;
          local_34 = 0;
          local_60 = TyInt32;
          goto LAB_00674293;
        }
        bVar4 = false;
        bVar3 = false;
        local_50 = 0;
        local_34 = 0;
        bVar6 = false;
        goto LAB_0067434a;
      }
      if (OVar15 != Simd128_ExtractLane_U8) {
        if (OVar15 != Simd128_ExtractLane_U16) goto LAB_00674046;
        goto LAB_0067418c;
      }
LAB_006740a6:
      if (7 < index) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                           ,0x293,"(laneIndex < 8)","laneIndex < 8");
        if (!bVar6) goto LAB_006748fc;
        *puVar9 = 0;
      }
      local_34 = (index & 1) << 4;
      index = index >> 1;
      local_50 = 0xffff;
      bVar3 = true;
      bVar4 = false;
      local_60 = TyInt16;
    }
    else {
      if (OVar15 == Simd128_ExtractLane_B4) goto LAB_0067413a;
      if (OVar15 == Simd128_ExtractLane_B8) goto LAB_006740a6;
      if (OVar15 != Simd128_ExtractLane_B16) goto LAB_00674046;
LAB_0067418c:
      if (0xf < index) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                           ,0x29d,"(laneIndex < 16)","laneIndex < 16");
        if (!bVar6) goto LAB_006748fc;
        *puVar9 = 0;
      }
      local_34 = index * 8 & 0x18;
      index = index >> 2;
      local_50 = 0xff;
      bVar4 = true;
      bVar3 = false;
      local_60 = TyInt8;
    }
LAB_00674293:
    iVar16 = 4;
    opcode = MOVD;
    bVar6 = false;
    bVar2 = true;
  }
LAB_0067434a:
  if (bVar6) {
    EmitExtractInt64(this,this_00,instr->m_src1,index,instr);
  }
  else {
    if (index != 0) {
      pRVar10 = IR::RegOpnd::New((local_40->super_Opnd).m_type,this->m_func);
      pIVar13 = IR::IntConstOpnd::New((ulong)(iVar16 * index),TyInt8,this->m_func,true);
      pIVar11 = IR::Instr::New(PSRLDQ,&pRVar10->super_Opnd,(Opnd *)local_40,&pIVar13->super_Opnd,
                               this->m_func);
      IR::Instr::InsertBefore(instr,pIVar11);
      Legalize<false>(pIVar11,false);
      local_40 = pRVar10;
    }
    pOVar12 = this_00;
    if (!bVar2) {
      pOVar12 = IR::Opnd::UseWithNewType(this_00,(local_40->super_Opnd).m_type,this->m_func);
    }
    pIVar11 = IR::Instr::New(opcode,pOVar12,&local_40->super_Opnd,this->m_func);
    IR::Instr::InsertBefore(instr,pIVar11);
  }
  uVar8 = (uint)instr->m_opcode;
  if (instr->m_opcode < Simd128_ExtractLane_U16) {
    if ((uVar8 == 0x2ed) || ((uVar8 == 0x32b || (uVar8 == 0x375)))) {
LAB_0067449c:
      if (local_34 != 0) {
        pIVar13 = IR::IntConstOpnd::New((ulong)local_34,TyInt8,this->m_func,false);
        pIVar11 = IR::Instr::New(SHR,this_00,this_00,&pIVar13->super_Opnd,this->m_func);
        IR::Instr::InsertBefore(instr,pIVar11);
        Legalize<false>(pIVar11,false);
      }
      if (!bVar3 && !bVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                           ,0x2ce,"(laneType == TyInt8 || laneType == TyInt16)",
                           "laneType == TyInt8 || laneType == TyInt16");
        if (!bVar6) goto LAB_006748fc;
        *puVar9 = 0;
      }
      if ((instr->m_opcode == Simd128_ExtractLane_I8) ||
         (instr->m_opcode == Simd128_ExtractLane_I16)) {
        if (bVar4) {
          pRVar10 = IR::RegOpnd::New(TyInt8,this->m_func);
          pIVar11 = IR::Instr::New(MOV,&pRVar10->super_Opnd,this_00,this->m_func);
          IR::Instr::InsertBefore(instr,pIVar11);
          Legalize<false>(pIVar11,false);
          pFVar14 = this->m_func;
          OVar15 = MOVSX;
        }
        else {
          pRVar10 = (RegOpnd *)IR::Opnd::UseWithNewType(this_00,local_60,this->m_func);
          pFVar14 = this->m_func;
          OVar15 = MOVSXW;
        }
        pIVar11 = IR::Instr::New(OVar15,this_00,&pRVar10->super_Opnd,pFVar14);
      }
      else {
        pIVar13 = IR::IntConstOpnd::New(local_50,TyInt32,this->m_func,false);
        pIVar11 = IR::Instr::New(AND,this_00,this_00,&pIVar13->super_Opnd,this->m_func);
      }
      IR::Instr::InsertBefore(instr,pIVar11);
      Legalize<false>(pIVar11,false);
    }
  }
  else if ((uVar8 - 0x397 < 0x39) &&
          ((0x100400000000001U >> ((ulong)(uVar8 - 0x397) & 0x3f) & 1) != 0)) goto LAB_0067449c;
  uVar8 = instr->m_opcode - 0x3bb;
  if ((uVar8 < 0x15) && ((0x100401U >> (uVar8 & 0x1f) & 1) != 0)) {
    pRVar10 = IR::RegOpnd::New(TyInt8,this->m_func);
    pIVar11 = IR::Instr::New(CMP,this->m_func);
    pOVar12 = IR::Opnd::UseWithNewType(this_00,local_60,this->m_func);
    if (pIVar11->m_src1 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
      if (!bVar6) goto LAB_006748fc;
      *puVar9 = 0;
    }
    pFVar14 = pIVar11->m_func;
    if (pOVar12->isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar6) goto LAB_006748fc;
      *puVar9 = 0;
    }
    bVar7 = pOVar12->field_0xb;
    if ((bVar7 & 2) != 0) {
      pOVar12 = IR::Opnd::Copy(pOVar12,pFVar14);
      bVar7 = pOVar12->field_0xb;
    }
    pOVar12->field_0xb = bVar7 | 2;
    pIVar11->m_src1 = pOVar12;
    pIVar13 = IR::IntConstOpnd::New(0,local_60,this->m_func,true);
    if (pIVar11->m_src2 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
      if (!bVar6) goto LAB_006748fc;
      *puVar9 = 0;
    }
    pFVar14 = pIVar11->m_func;
    if ((pIVar13->super_Opnd).isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar6) {
LAB_006748fc:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar9 = 0;
    }
    bVar7 = (pIVar13->super_Opnd).field_0xb;
    if ((bVar7 & 2) != 0) {
      pIVar13 = (IntConstOpnd *)IR::Opnd::Copy(&pIVar13->super_Opnd,pFVar14);
      bVar7 = (pIVar13->super_Opnd).field_0xb;
    }
    (pIVar13->super_Opnd).field_0xb = bVar7 | 2;
    pIVar11->m_src2 = &pIVar13->super_Opnd;
    IR::Instr::InsertBefore(instr,pIVar11);
    Legalize<false>(pIVar11,false);
    pIVar11 = IR::Instr::New(MOV,&pRVar10->super_Opnd,this_00,this->m_func);
    IR::Instr::InsertBefore(instr,pIVar11);
    Legalize<false>(pIVar11,false);
    pIVar11 = IR::Instr::New(SETNE,&pRVar10->super_Opnd,&pRVar10->super_Opnd,this->m_func);
    IR::Instr::InsertBefore(instr,pIVar11);
    Legalize<false>(pIVar11,false);
    pIVar11 = IR::Instr::New(MOVSX,this_00,&pRVar10->super_Opnd,this->m_func);
    IR::Instr::InsertBefore(instr,pIVar11);
  }
  pIVar11 = instr->m_prev;
  IR::Instr::Remove(instr);
  return pIVar11;
}

Assistant:

IR::Instr* LowererMD::Simd128LowerLdLane(IR::Instr *instr)
{
    IR::Opnd* dst, *src1, *src2;
    Js::OpCode movOpcode = Js::OpCode::MOVSS;
    uint laneWidth = 0, laneIndex = 0, shamt = 0, mask = 0;
    IRType laneType = TyInt32;
    dst = instr->GetDst();
    src1 = instr->GetSrc1();
    src2 = instr->GetSrc2();

    Assert(dst && dst->IsRegOpnd() && (dst->GetType() == TyFloat32 || dst->GetType() == TyInt32 || dst->GetType() == TyUint32 || dst->GetType() == TyFloat64 || dst->IsInt64()));
    Assert(src1 && src1->IsRegOpnd() && src1->IsSimd128());
    Assert(src2 && src2->IsIntConstOpnd());


    laneIndex = (uint)src2->AsIntConstOpnd()->AsUint32();
    laneWidth = 4;
    switch (instr->m_opcode)
    {
    case Js::OpCode::Simd128_ExtractLane_I2:
        laneWidth = 8;
        break;
    case Js::OpCode::Simd128_ExtractLane_F4:
        movOpcode = Js::OpCode::MOVSS;
        Assert(laneIndex < 4);
        break;
    case Js::OpCode::Simd128_ExtractLane_I8:
    case Js::OpCode::Simd128_ExtractLane_U8:
    case Js::OpCode::Simd128_ExtractLane_B8:
        movOpcode = Js::OpCode::MOVD;
        Assert(laneIndex < 8);
        shamt = (laneIndex % 2) * 16;
        laneIndex = laneIndex / 2;
        laneType = TyInt16;
        mask = 0x0000ffff;
        break;
    case Js::OpCode::Simd128_ExtractLane_I16:
    case Js::OpCode::Simd128_ExtractLane_U16:
    case Js::OpCode::Simd128_ExtractLane_B16:
        movOpcode = Js::OpCode::MOVD;
        Assert(laneIndex < 16);
        shamt = (laneIndex % 4) * 8;
        laneIndex = laneIndex / 4;
        laneType = TyInt8;
        mask = 0x000000ff;
        break;
    case Js::OpCode::Simd128_ExtractLane_U4:
    case Js::OpCode::Simd128_ExtractLane_I4:
    case Js::OpCode::Simd128_ExtractLane_B4:
        movOpcode = Js::OpCode::MOVD;
        Assert(laneIndex < 4);
        break;
    default:
        Assert(UNREACHED);
    }

    if (laneWidth == 8) //Simd128_ExtractLane_I2
    {
        EmitExtractInt64(dst, instr->GetSrc1(), laneIndex, instr);
    }
    else
    {
        IR::Opnd* tmp = src1;
        if (laneIndex != 0)
        {
            // tmp = PSRLDQ src1, shamt
            tmp = IR::RegOpnd::New(src1->GetType(), m_func);
            IR::Instr *shiftInstr = IR::Instr::New(Js::OpCode::PSRLDQ, tmp, src1, IR::IntConstOpnd::New(laneWidth * laneIndex, TyInt8, m_func, true), m_func);
            instr->InsertBefore(shiftInstr);
            Legalize(shiftInstr);
        }
        // MOVSS/MOVSD/MOVD dst, tmp
        instr->InsertBefore(IR::Instr::New(movOpcode, movOpcode == Js::OpCode::MOVD ? dst : dst->UseWithNewType(tmp->GetType(), m_func), tmp, m_func));
    }

    // dst has the 4-byte lane
    if (instr->m_opcode == Js::OpCode::Simd128_ExtractLane_I8 || instr->m_opcode == Js::OpCode::Simd128_ExtractLane_U8 || instr->m_opcode == Js::OpCode::Simd128_ExtractLane_B8 ||
        instr->m_opcode == Js::OpCode::Simd128_ExtractLane_U16 || instr->m_opcode == Js::OpCode::Simd128_ExtractLane_I16 || instr->m_opcode == Js::OpCode::Simd128_ExtractLane_B16)
    {
        // extract the 1/2 bytes sublane
        IR::Instr *newInstr = nullptr;
        if (shamt != 0)
        {
            // SHR dst, dst, shamt
            newInstr = IR::Instr::New(Js::OpCode::SHR, dst, dst, IR::IntConstOpnd::New((IntConstType)shamt, TyInt8, m_func), m_func);
            instr->InsertBefore(newInstr);
            Legalize(newInstr);
        }

        Assert(laneType == TyInt8 || laneType == TyInt16);
        // zero or sign-extend upper bits
        if (instr->m_opcode == Js::OpCode::Simd128_ExtractLane_I8 || instr->m_opcode == Js::OpCode::Simd128_ExtractLane_I16)
        {
            if (laneType == TyInt8)
            {
                IR::RegOpnd * tmp = IR::RegOpnd::New(TyInt8, m_func);
                newInstr = IR::Instr::New(Js::OpCode::MOV, tmp, dst, m_func);
                instr->InsertBefore(newInstr);
                Legalize(newInstr);
                newInstr = IR::Instr::New(Js::OpCode::MOVSX, dst, tmp, m_func);
            }
            else
            {
                newInstr = IR::Instr::New(Js::OpCode::MOVSXW, dst, dst->UseWithNewType(laneType, m_func), m_func);
            }
        }
        else
        {
            newInstr = IR::Instr::New(Js::OpCode::AND, dst, dst, IR::IntConstOpnd::New(mask, TyInt32, m_func), m_func);
        }

        instr->InsertBefore(newInstr);
        Legalize(newInstr);
    }
    if (instr->m_opcode == Js::OpCode::Simd128_ExtractLane_B4 || instr->m_opcode == Js::OpCode::Simd128_ExtractLane_B8 ||
        instr->m_opcode == Js::OpCode::Simd128_ExtractLane_B16)
    {
        IR::Instr* pInstr = nullptr;
        IR::RegOpnd* tmp = IR::RegOpnd::New(TyInt8, m_func);

        // cmp      dst, 0
        pInstr = IR::Instr::New(Js::OpCode::CMP, m_func);
        pInstr->SetSrc1(dst->UseWithNewType(laneType, m_func));
        pInstr->SetSrc2(IR::IntConstOpnd::New(0, laneType, m_func, true));
        instr->InsertBefore(pInstr);
        Legalize(pInstr);

        // mov     tmp(TyInt8), dst
        pInstr = IR::Instr::New(Js::OpCode::MOV, tmp, dst, m_func);
        instr->InsertBefore(pInstr);
        Legalize(pInstr);

        // setne     tmp(TyInt8)
        pInstr = IR::Instr::New(Js::OpCode::SETNE, tmp, tmp, m_func);
        instr->InsertBefore(pInstr);
        Legalize(pInstr);

        // movsx      dst, tmp(TyInt8)
        instr->InsertBefore(IR::Instr::New(Js::OpCode::MOVSX, dst, tmp, m_func));
    }

    IR::Instr* prevInstr = instr->m_prev;
    instr->Remove();
    return prevInstr;
}